

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_portals.cxx
# Opt level: O0

void __thiscall level_tools::reconstruct_portals(level_tools *this)

{
  bool bVar1;
  xr_level_portals *pxVar2;
  portal_data_vec *this_00;
  xr_scene_portals *this_01;
  xr_custom_object_vec *this_02;
  size_type __n;
  xr_scene_sectors *this_03;
  xr_custom_object_vec *this_04;
  reference pppVar3;
  xr_portal_object *this_05;
  char *pcVar4;
  string *psVar5;
  reference ppxVar6;
  string *psVar7;
  vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>> *this_06;
  const_iterator __first;
  const_iterator __last;
  xr_portal_object *local_70 [3];
  xr_portal_object *local_58;
  xr_portal_object *new_portal;
  portal_data *portal;
  portal_data_vec_cit end;
  portal_data_vec_cit it;
  xr_name_gen name;
  xr_custom_object_vec *sectors;
  xr_custom_object_vec *cobjects;
  portal_data_vec *portals;
  level_tools *this_local;
  
  pxVar2 = xray_re::xr_level::portals(this->m_level);
  if (pxVar2 != (xr_level_portals *)0x0) {
    xray_re::msg("building %s","portal.part");
    pxVar2 = xray_re::xr_level::portals(this->m_level);
    this_00 = xray_re::xr_level_portals::portals(pxVar2);
    this_01 = xray_re::xr_scene::portals(this->m_scene);
    this_02 = xray_re::xr_scene_objects::objects(&this_01->super_xr_scene_objects);
    __n = std::vector<xray_re::portal_data_*,_std::allocator<xray_re::portal_data_*>_>::size
                    (this_00);
    std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::reserve
              (this_02,__n);
    this_03 = xray_re::xr_scene::sectors(this->m_scene);
    this_04 = xray_re::xr_scene_objects::objects(&this_03->super_xr_scene_objects);
    bVar1 = std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::
            empty(this_04);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!sectors.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_portals.cxx"
                    ,0x16,"void level_tools::reconstruct_portals()");
    }
    xray_re::xr_name_gen::xr_name_gen((xr_name_gen *)&it,"portal",true);
    end._M_current =
         (portal_data **)
         std::vector<xray_re::portal_data_*,_std::allocator<xray_re::portal_data_*>_>::begin
                   (this_00);
    portal = (portal_data *)
             std::vector<xray_re::portal_data_*,_std::allocator<xray_re::portal_data_*>_>::end
                       (this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&end,(__normal_iterator<xray_re::portal_data_*const_*,_std::vector<xray_re::portal_data_*,_std::allocator<xray_re::portal_data_*>_>_>
                                    *)&portal), bVar1) {
      pppVar3 = __gnu_cxx::
                __normal_iterator<xray_re::portal_data_*const_*,_std::vector<xray_re::portal_data_*,_std::allocator<xray_re::portal_data_*>_>_>
                ::operator*(&end);
      new_portal = (xr_portal_object *)*pppVar3;
      this_05 = (xr_portal_object *)operator_new(200);
      xray_re::xr_portal_object::xr_portal_object(this_05,this->m_scene);
      local_58 = this_05;
      pcVar4 = xray_re::xr_name_gen::get((xr_name_gen *)&it);
      psVar5 = xray_re::xr_custom_object::co_name_abi_cxx11_(&local_58->super_xr_custom_object);
      std::__cxx11::string::operator=((string *)psVar5,pcVar4);
      ppxVar6 = std::
                vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::
                operator[](this_04,(ulong)*(ushort *)
                                           &(new_portal->super_xr_custom_object).
                                            _vptr_xr_custom_object);
      psVar5 = xray_re::xr_custom_object::co_name_abi_cxx11_(*ppxVar6);
      psVar7 = xray_re::xr_portal_object::sector_front_abi_cxx11_(local_58);
      std::__cxx11::string::operator=((string *)psVar7,(string *)psVar5);
      ppxVar6 = std::
                vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::
                operator[](this_04,(ulong)*(ushort *)
                                           ((long)&(new_portal->super_xr_custom_object).
                                                   _vptr_xr_custom_object + 2));
      psVar5 = xray_re::xr_custom_object::co_name_abi_cxx11_(*ppxVar6);
      psVar7 = xray_re::xr_portal_object::sector_back_abi_cxx11_(local_58);
      std::__cxx11::string::operator=((string *)psVar7,(string *)psVar5);
      this_06 = (vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>> *)
                xray_re::xr_portal_object::vertices(local_58);
      __first = xray_re::_svector<xray_re::_vector3<float>,_6U>::begin
                          ((_svector<xray_re::_vector3<float>,_6U> *)
                           ((long)&(new_portal->super_xr_custom_object)._vptr_xr_custom_object + 4))
      ;
      __last = xray_re::_svector<xray_re::_vector3<float>,_6U>::end
                         ((_svector<xray_re::_vector3<float>,_6U> *)
                          ((long)&(new_portal->super_xr_custom_object)._vptr_xr_custom_object + 4));
      std::vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>>::
      assign<xray_re::_vector3<float>const*,void>(this_06,__first,__last);
      local_70[0] = local_58;
      std::vector<xray_re::xr_custom_object_*,_std::allocator<xray_re::xr_custom_object_*>_>::
      push_back(this_02,(value_type *)local_70);
      __gnu_cxx::
      __normal_iterator<xray_re::portal_data_*const_*,_std::vector<xray_re::portal_data_*,_std::allocator<xray_re::portal_data_*>_>_>
      ::operator++(&end);
      xray_re::xr_name_gen::next((xr_name_gen *)&it);
    }
    xray_re::xr_level::clear_portals(this->m_level);
    xray_re::xr_name_gen::~xr_name_gen((xr_name_gen *)&it);
  }
  return;
}

Assistant:

void level_tools::reconstruct_portals()
{
	if (m_level->portals() == 0)
		return;
	msg("building %s", "portal.part");

	const portal_data_vec& portals = m_level->portals()->portals();
	xr_custom_object_vec& cobjects = m_scene->portals()->objects();
	cobjects.reserve(portals.size());

	xr_custom_object_vec& sectors = m_scene->sectors()->objects();
	xr_assert(!sectors.empty());

	xr_name_gen name("portal");
	for (portal_data_vec_cit it = portals.begin(), end = portals.end(); it != end; ++it, name.next()) {
		const portal_data* portal = *it;
		xr_portal_object* new_portal = new xr_portal_object(*m_scene);
		new_portal->co_name() = name.get();
		new_portal->sector_front() = sectors[portal->sector_front]->co_name();
		new_portal->sector_back() = sectors[portal->sector_back]->co_name();
		new_portal->vertices().assign(portal->vertices.begin(), portal->vertices.end());
		cobjects.push_back(new_portal);
	}
	m_level->clear_portals();
}